

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTextureBorderClampSamplingTexture.cpp
# Opt level: O0

void __thiscall
glcts::TestConfiguration<int,_int>::TestConfiguration
          (TestConfiguration<int,_int> *this,TestConfiguration<int,_int> *configuration)

{
  GLsizei GVar1;
  GLenum GVar2;
  GLuint GVar3;
  int iVar4;
  TestConfiguration<int,_int> *configuration_local;
  TestConfiguration<int,_int> *this_local;
  
  this->_vptr_TestConfiguration = (_func_int **)&PTR__TestConfiguration_0326e018;
  GVar1 = get_n_in_components(configuration);
  this->m_n_in_components = GVar1;
  GVar1 = get_n_out_components(configuration);
  this->m_n_out_components = GVar1;
  GVar2 = get_target(configuration);
  this->m_target = GVar2;
  GVar2 = get_input_internal_format(configuration);
  this->m_input_internal_format = GVar2;
  GVar2 = get_output_internal_format(configuration);
  this->m_output_internal_format = GVar2;
  GVar2 = get_filtering(configuration);
  this->m_filtering = GVar2;
  GVar2 = get_input_format(configuration);
  this->m_input_format = GVar2;
  GVar2 = get_output_format(configuration);
  this->m_output_format = GVar2;
  GVar3 = get_width(configuration);
  this->m_width = GVar3;
  GVar3 = get_height(configuration);
  this->m_height = GVar3;
  GVar3 = get_depth(configuration);
  this->m_depth = GVar3;
  iVar4 = get_init_value(configuration);
  this->m_init_value = iVar4;
  iVar4 = get_init_border_color(configuration);
  this->m_init_border_color = iVar4;
  iVar4 = get_expected_value(configuration);
  this->m_expected_value = iVar4;
  iVar4 = get_expected_border_color(configuration);
  this->m_expected_border_color = iVar4;
  GVar2 = get_input_type(configuration);
  this->m_input_type = GVar2;
  GVar2 = get_output_type(configuration);
  this->m_output_type = GVar2;
  return;
}

Assistant:

TestConfiguration<InputType, OutputType>::TestConfiguration(const TestConfiguration& configuration)
{
	m_n_in_components		 = configuration.get_n_in_components();
	m_n_out_components		 = configuration.get_n_out_components();
	m_target				 = configuration.get_target();
	m_input_internal_format  = configuration.get_input_internal_format();
	m_output_internal_format = configuration.get_output_internal_format();
	m_filtering				 = configuration.get_filtering();
	m_input_format			 = configuration.get_input_format();
	m_output_format			 = configuration.get_output_format();
	m_width					 = configuration.get_width();
	m_height				 = configuration.get_height();
	m_depth					 = configuration.get_depth();
	m_init_value			 = configuration.get_init_value();
	m_init_border_color		 = configuration.get_init_border_color();
	m_expected_value		 = configuration.get_expected_value();
	m_expected_border_color  = configuration.get_expected_border_color();
	m_input_type			 = configuration.get_input_type();
	m_output_type			 = configuration.get_output_type();
}